

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O3

void __thiscall
cfd::api::json::DecodePsbtOutput::ConvertFromStruct
          (DecodePsbtOutput *this,DecodePsbtOutputStruct *data)

{
  PsbtScriptData::ConvertFromStruct(&this->redeem_script_,&data->redeem_script);
  PsbtScriptData::ConvertFromStruct(&this->witness_script_,&data->witness_script);
  core::JsonObjectVector<cfd::api::json::PsbtBip32Data,_PsbtBip32DataStruct>::ConvertFromStruct
            (&this->bip32_derivs_,&data->bip32_derivs);
  core::JsonObjectVector<cfd::api::json::PsbtMapData,_PsbtMapDataStruct>::ConvertFromStruct
            (&this->unknown_,&data->unknown);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->ignore_items)._M_t,&(data->ignore_items)._M_t);
  return;
}

Assistant:

void DecodePsbtOutput::ConvertFromStruct(
    const DecodePsbtOutputStruct& data) {
  redeem_script_.ConvertFromStruct(data.redeem_script);
  witness_script_.ConvertFromStruct(data.witness_script);
  bip32_derivs_.ConvertFromStruct(data.bip32_derivs);
  unknown_.ConvertFromStruct(data.unknown);
  ignore_items = data.ignore_items;
}